

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O1

int __thiscall
trieste::detail::Not::clone(Not *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  undefined1 local_29;
  Not *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  local_28 = (Not *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::Not,std::allocator<trieste::detail::Not>,trieste::detail::Not_const&>
            (&local_20,&local_28,(allocator<trieste::detail::Not> *)&local_29,(Not *)__fn);
  (this->super_PatternDef)._vptr_PatternDef = (_func_int **)local_28;
  (this->super_PatternDef).continuation.
  super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_PatternDef).continuation.
  super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_20._M_pi;
  return (int)this;
}

Assistant:

PatternPtr clone() const& override
      {
        return std::make_shared<Not>(*this);
      }